

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O2

bool __thiscall IntVarEL::setVal(IntVarEL *this,int64_t v,Reason r,bool channel)

{
  int *piVar1;
  bool bVar2;
  Lit p;
  undefined3 in_register_00000009;
  int v_00;
  
  if (CONCAT31(in_register_00000009,channel) != 0) {
    p.x = (*(this->super_IntVar).super_Var.super_Branching._vptr_Branching[0xd])(this,v,1);
    SAT::cEnqueue(&sat,p,r);
  }
  bVar2 = IntVar::indomain(&this->super_IntVar,v);
  if (bVar2) {
    piVar1 = &(this->super_IntVar).changes;
    *(byte *)piVar1 = (byte)*piVar1 | 9;
    v_00 = (int)v;
    channelFix(this,v_00);
    if ((this->super_IntVar).min.v < v) {
      Tint::operator=(&(this->super_IntVar).min,v_00);
      piVar1 = &(this->super_IntVar).changes;
      *(byte *)piVar1 = (byte)*piVar1 | 2;
    }
    if (v < (this->super_IntVar).max.v) {
      Tint::operator=(&(this->super_IntVar).max,v_00);
      piVar1 = &(this->super_IntVar).changes;
      *(byte *)piVar1 = (byte)*piVar1 | 4;
    }
    IntVar::pushInQueue(&this->super_IntVar);
  }
  return bVar2;
}

Assistant:

bool IntVarEL::setVal(int64_t v, Reason r, bool channel) {
	assert(setValNotR(v));
	if (channel) {
		sat.cEnqueue(getLit(v, LR_EQ), r);
	}
	if (!indomain(v)) {
		assert(sat.confl);
		return false;
	}
	changes |= EVENT_C | EVENT_F;
	channelFix(static_cast<int>(v));
	if (min < v) {
		min = static_cast<int>(v);
		changes |= EVENT_L;
	}
	if (max > v) {
		max = static_cast<int>(v);
		changes |= EVENT_U;
	}
#if INT_DOMAIN_LIST
	vals_count = 1;
#endif
	pushInQueue();
	return true;
}